

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::accumulateScaleFactors
          (BeagleCPUImpl<float,_1,_0> *this,int *scalingIndices,int count,int cumulativeScalingIndex
          )

{
  int iVar1;
  float *pfVar2;
  float *pfVar3;
  short **ppsVar4;
  int *piVar5;
  short *psVar6;
  int j;
  long lVar7;
  ulong uVar8;
  int j_1;
  ulong uVar9;
  ulong uVar10;
  float fVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined8 in_XMM3_Qb;
  
  if ((this->kFlags & 0x80) == 0) {
    pfVar2 = this->gScaleBuffers[cumulativeScalingIndex];
    for (uVar10 = 0; uVar10 != (uint)(~(count >> 0x1f) & count); uVar10 = uVar10 + 1) {
      pfVar3 = this->gScaleBuffers[scalingIndices[uVar10]];
      for (lVar7 = 0; lVar7 < this->kPatternCount; lVar7 = lVar7 + 1) {
        if ((this->kFlags & 0x400) == 0) {
          dVar12 = log((double)pfVar3[lVar7]);
          fVar11 = (float)(dVar12 + (double)pfVar2[lVar7]);
        }
        else {
          fVar11 = pfVar3[lVar7] + pfVar2[lVar7];
        }
        pfVar2[lVar7] = fVar11;
      }
    }
  }
  else {
    pfVar2 = *this->gScaleBuffers;
    uVar10 = (ulong)(uint)(~(this->kPatternCount >> 0x1f) & this->kPatternCount);
    for (uVar8 = 0; uVar10 != uVar8; uVar8 = uVar8 + 1) {
      pfVar2[uVar8] = 0.0;
    }
    iVar1 = this->kTipCount;
    ppsVar4 = this->gAutoScaleBuffers;
    piVar5 = this->gActiveScalingFactors;
    for (uVar8 = 0; uVar8 != (uint)(~(count >> 0x1f) & count); uVar8 = uVar8 + 1) {
      lVar7 = (long)scalingIndices[uVar8] - (long)iVar1;
      if (piVar5[lVar7] != 0) {
        psVar6 = ppsVar4[lVar7];
        for (uVar9 = 0; uVar10 != uVar9; uVar9 = uVar9 + 1) {
          auVar14._0_8_ = (double)pfVar2[uVar9];
          auVar14._8_8_ = in_XMM3_Qb;
          auVar13._0_8_ = (double)(int)psVar6[uVar9];
          auVar13._8_8_ = in_XMM3_Qb;
          auVar13 = vfmadd231sd_fma(auVar14,auVar13,ZEXT816(0x3fe62e42fefa39ef));
          pfVar2[uVar9] = (float)auVar13._0_8_;
        }
      }
    }
  }
  return 0;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::accumulateScaleFactors(const int* scalingIndices,
                                                int  count,
                                                int  cumulativeScalingIndex) {
    if (kFlags & BEAGLE_FLAG_SCALING_AUTO) {
        REALTYPE* cumulativeScaleBuffer = gScaleBuffers[0];
        for(int j=0; j<kPatternCount; j++)
            cumulativeScaleBuffer[j] =  0;
        for(int i=0; i<count; i++) {
            int sIndex = scalingIndices[i] - kTipCount;
            if (gActiveScalingFactors[sIndex]) {
                const signed short* scaleBuffer = gAutoScaleBuffers[sIndex];
                for(int j=0; j<kPatternCount; j++) {
                    cumulativeScaleBuffer[j] += M_LN2 * scaleBuffer[j];
                }
            }
        }

    } else {
        REALTYPE* cumulativeScaleBuffer = gScaleBuffers[cumulativeScalingIndex];
        for(int i=0; i<count; i++) {
            const REALTYPE* scaleBuffer = gScaleBuffers[scalingIndices[i]];
            for(int j=0; j<kPatternCount; j++) {
                if (kFlags & BEAGLE_FLAG_SCALERS_LOG)
                    cumulativeScaleBuffer[j] += scaleBuffer[j];
                else
                    cumulativeScaleBuffer[j] += log(scaleBuffer[j]);
            }
        }

        if (DEBUGGING_OUTPUT) {
            fprintf(stderr,"Accumulating %d scale buffers into #%d\n",count,cumulativeScalingIndex);
            for(int j=0; j<kPatternCount; j++) {
                fprintf(stderr,"cumulativeScaleBuffer[%d] = %2.5e\n",j,cumulativeScaleBuffer[j]);
            }
        }
    }

    return BEAGLE_SUCCESS;
}